

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

bool IsKnownWin32SafeCharacter(char ch)

{
  char ch_local;
  
  return (byte)(ch | 2U) != 0x22;
}

Assistant:

static inline bool IsKnownWin32SafeCharacter(char ch) {
  switch (ch) {
    case ' ':
    case '"':
      return false;
    default:
      return true;
  }
}